

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonstats.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  undefined8 *in_RSI;
  int in_EDI;
  bool bVar2;
  stat_t s;
  exception *e;
  string_view p;
  char *filename;
  int optind;
  allocator<char> *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  string_view *in_stack_ffffffffffffff50;
  byte local_a8;
  allocator<char> local_81;
  string local_80 [32];
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined8 local_40;
  int local_34;
  undefined8 *local_30;
  uint local_24;
  
  local_24 = 0;
  local_34 = 1;
  local_30 = in_RSI;
  if (in_EDI < 2) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Reads json, prints stats. ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar1 = std::operator<<(poVar1,(char *)*local_30);
    poVar1 = std::operator<<(poVar1," <jsonfile>");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  local_40 = in_RSI[1];
  if (2 < in_EDI) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"warning: ignoring everything after ");
    poVar1 = std::operator<<(poVar1,(char *)local_30[local_34 + 1]);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  local_60 = (basic_string_view<char,_std::char_traits<char>_>)get_corpus(local_80);
  local_50 = local_60;
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  simdjson_computestats(in_stack_ffffffffffffff50);
  bVar2 = (local_a8 & 1) != 0;
  if (bVar2) {
    printf(
          "# integer_count float_count string_count backslash_count nonasciibyte_count object_count array_count null_count true_count false_count byte_count structural_indexes_count\n"
          );
    printf("%zu %zu %zu %zu %zu %zu %zu %zu %zu %zu %zu %zu\n",local_108,local_100,local_f8,local_f0
           ,local_e8,local_e0,local_d8,local_d0,local_c8,local_c0,local_b8,in_stack_ffffffffffffff50
          );
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"not a valid JSON");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  local_24 = (uint)!bVar2;
  return local_24;
}

Assistant:

int main(int argc, char *argv[]) {
  int optind = 1;
  if (optind >= argc) {
    cerr << "Reads json, prints stats. " << endl;
    cerr << "Usage: " << argv[0] << " <jsonfile>" << endl;

    exit(1);
  }
  const char *filename = argv[optind];
  if (optind + 1 < argc) {
    std::cerr << "warning: ignoring everything after " << argv[optind + 1] << std::endl;
  }
  std::string_view p;
  try {
    p = get_corpus(filename);
  } catch (const std::exception &e) { // caught by reference to base
    std::cerr << "Could not load the file " << filename << std::endl;
    return EXIT_FAILURE;
  }
  stat_t s =  simdjson_computestats(p);
  if(!s.valid) {
    std::cerr << "not a valid JSON" << std::endl;
    return EXIT_FAILURE;
  }


  printf("# integer_count float_count string_count backslash_count nonasciibyte_count object_count array_count null_count true_count false_count byte_count structural_indexes_count\n");
  printf("%zu %zu %zu %zu %zu %zu %zu %zu %zu %zu %zu %zu\n", s.integer_count, s.float_count,
  s.string_count, s.backslash_count, s.nonasciibyte_count, s.object_count, s.array_count,
  s.null_count, s.true_count, s.false_count, s.byte_count, s.structural_indexes_count);
  return EXIT_SUCCESS;
}